

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Choice.cxx
# Opt level: O0

int __thiscall Fl_Choice::handle(Fl_Choice *this,int e)

{
  uint uVar1;
  Fl_Color FVar2;
  Fl_Color FVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Fl_Menu_Item *pFVar8;
  char *pcVar9;
  Fl_Menu_Item *pFVar10;
  Fl_Menu_Item *pFStack_28;
  Fl_Color c;
  Fl_Menu_Item *v;
  int e_local;
  Fl_Choice *this_local;
  
  pFVar8 = Fl_Menu_::menu(&this->super_Fl_Menu_);
  if ((pFVar8 == (Fl_Menu_Item *)0x0) ||
     (pFVar8 = Fl_Menu_::menu(&this->super_Fl_Menu_), pFVar8->text == (char *)0x0)) {
    return 0;
  }
  switch(e) {
  default:
    return 0;
  case 3:
  case 4:
    return 1;
  case 6:
  case 7:
    iVar7 = Fl::visible_focus();
    if (iVar7 == 0) {
      return 0;
    }
    Fl_Widget::redraw((Fl_Widget *)this);
    return 1;
  case 8:
    iVar7 = Fl::event_key();
    if ((iVar7 != 0x20) || (uVar1 = Fl::event_state(), (uVar1 & 0x4d0000) != 0)) {
      return 0;
    }
  case 1:
    iVar7 = Fl::visible_focus();
    if (iVar7 != 0) {
      Fl::focus((Fl_Widget *)this);
    }
    break;
  case 0xc:
    iVar7 = Fl_Widget::test_shortcut((Fl_Widget *)this);
    if (iVar7 == 0) {
      pFVar8 = Fl_Menu_::menu(&this->super_Fl_Menu_);
      pFVar8 = Fl_Menu_Item::test_shortcut(pFVar8);
      if (pFVar8 != (Fl_Menu_Item *)0x0) {
        pFVar10 = Fl_Menu_::mvalue(&this->super_Fl_Menu_);
        if (pFVar8 != pFVar10) {
          Fl_Widget::redraw((Fl_Widget *)this);
        }
        Fl_Menu_::picked(&this->super_Fl_Menu_,pFVar8);
        return 1;
      }
      return 0;
    }
  }
  pcVar9 = Fl::scheme();
  if (pcVar9 == (char *)0x0) {
    FVar2 = Fl_Menu_::textcolor(&this->super_Fl_Menu_);
    FVar2 = fl_contrast(FVar2,7);
    FVar3 = Fl_Menu_::textcolor(&this->super_Fl_Menu_);
    if (FVar2 == FVar3) {
      FVar2 = Fl_Widget::color((Fl_Widget *)this);
      Fl_Widget::color((Fl_Widget *)this,7);
      pFVar8 = Fl_Menu_::menu(&this->super_Fl_Menu_);
      iVar7 = Fl_Widget::x((Fl_Widget *)this);
      iVar4 = Fl_Widget::y((Fl_Widget *)this);
      iVar5 = Fl_Widget::w((Fl_Widget *)this);
      iVar6 = Fl_Widget::h((Fl_Widget *)this);
      pFVar10 = Fl_Menu_::mvalue(&this->super_Fl_Menu_);
      pFStack_28 = Fl_Menu_Item::pulldown
                             (pFVar8,iVar7,iVar4,iVar5,iVar6,pFVar10,&this->super_Fl_Menu_,
                              (Fl_Menu_Item *)0x0,0);
      Fl_Widget::color((Fl_Widget *)this,FVar2);
      goto LAB_001dc088;
    }
  }
  pFVar8 = Fl_Menu_::menu(&this->super_Fl_Menu_);
  iVar7 = Fl_Widget::x((Fl_Widget *)this);
  iVar4 = Fl_Widget::y((Fl_Widget *)this);
  iVar5 = Fl_Widget::w((Fl_Widget *)this);
  iVar6 = Fl_Widget::h((Fl_Widget *)this);
  pFVar10 = Fl_Menu_::mvalue(&this->super_Fl_Menu_);
  pFStack_28 = Fl_Menu_Item::pulldown
                         (pFVar8,iVar7,iVar4,iVar5,iVar6,pFVar10,&this->super_Fl_Menu_,
                          (Fl_Menu_Item *)0x0,0);
LAB_001dc088:
  if ((pFStack_28 != (Fl_Menu_Item *)0x0) && (iVar7 = Fl_Menu_Item::submenu(pFStack_28), iVar7 == 0)
     ) {
    pFVar8 = Fl_Menu_::mvalue(&this->super_Fl_Menu_);
    if (pFStack_28 != pFVar8) {
      Fl_Widget::redraw((Fl_Widget *)this);
    }
    Fl_Menu_::picked(&this->super_Fl_Menu_,pFStack_28);
  }
  return 1;
}

Assistant:

int Fl_Choice::handle(int e) {
  if (!menu() || !menu()->text) return 0;
  const Fl_Menu_Item* v;
  switch (e) {
  case FL_ENTER:
  case FL_LEAVE:
    return 1;

  case FL_KEYBOARD:
    if (Fl::event_key() != ' ' ||
        (Fl::event_state() & (FL_SHIFT | FL_CTRL | FL_ALT | FL_META))) return 0;
  case FL_PUSH:
    if (Fl::visible_focus()) Fl::focus(this);
  J1:
    if (Fl::scheme()
	|| fl_contrast(textcolor(), FL_BACKGROUND2_COLOR) != textcolor()) {
      v = menu()->pulldown(x(), y(), w(), h(), mvalue(), this);
    } else {
      // In order to preserve the old look-n-feel of "white" menus,
      // temporarily override the color() of this widget...
      Fl_Color c = color();
      color(FL_BACKGROUND2_COLOR);
      v = menu()->pulldown(x(), y(), w(), h(), mvalue(), this);
      color(c);
    }
    if (!v || v->submenu()) return 1;
    if (v != mvalue()) redraw();
    picked(v);
    return 1;
  case FL_SHORTCUT:
    if (Fl_Widget::test_shortcut()) goto J1;
    v = menu()->test_shortcut();
    if (!v) return 0;
    if (v != mvalue()) redraw();
    picked(v);
    return 1;
  case FL_FOCUS:
  case FL_UNFOCUS:
    if (Fl::visible_focus()) {
      redraw();
      return 1;
    } else return 0;
  default:
    return 0;
  }
}